

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap_opkill.h
# Opt level: O0

Analysis __thiscall spvtools::opt::WrapOpKill::GetPreservedAnalyses(WrapOpKill *this)

{
  Analysis AVar1;
  WrapOpKill *this_local;
  
  AVar1 = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  AVar1 = opt::operator|(AVar1,kAnalysisDecorations);
  AVar1 = opt::operator|(AVar1,kAnalysisCombinators);
  AVar1 = opt::operator|(AVar1,kAnalysisNameMap);
  AVar1 = opt::operator|(AVar1,kAnalysisBuiltinVarId);
  AVar1 = opt::operator|(AVar1,kAnalysisConstants);
  AVar1 = opt::operator|(AVar1,kAnalysisTypes);
  return AVar1;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisDecorations | IRContext::kAnalysisCombinators |
           IRContext::kAnalysisNameMap | IRContext::kAnalysisBuiltinVarId |
           IRContext::kAnalysisConstants | IRContext::kAnalysisTypes;
  }